

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  string *psVar1;
  string *psVar2;
  bool bVar3;
  undefined8 *puVar4;
  basic_istream<char,_std::char_traits<char>_> *pbVar5;
  Controller *unaff_R14;
  allocator<char> local_a9;
  string *local_a8;
  string *local_a0;
  Controller *local_98;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  Tools::getInstance();
  Logger::getInstance();
  local_a0 = (string *)operator_new(0x20);
  *(string **)local_a0 = local_a0 + 0x10;
  *(long *)(local_a0 + 8) = 0;
  local_a0[0x10] = (string)0x0;
  local_a8 = (string *)operator_new(0x20);
  *(string **)local_a8 = local_a8 + 0x10;
  *(long *)(local_a8 + 8) = 0;
  local_a8[0x10] = (string)0x0;
  puVar4 = (undefined8 *)operator_new(0x20);
  *puVar4 = puVar4 + 2;
  puVar4[1] = 0;
  *(undefined1 *)(puVar4 + 2) = 0;
  bVar3 = true;
  while (psVar2 = local_a0, bVar3) {
    pbVar5 = std::operator>>((basic_istream<char,_std::char_traits<char>_> *)&std::cin,
                             *(char **)local_a0);
    psVar1 = local_a8;
    pbVar5 = std::operator>>(pbVar5,*(char **)local_a8);
    std::operator>>(pbVar5,(char *)*puVar4);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,*(char **)psVar2,&local_a9);
    bVar3 = std::operator==(&local_50,"ex");
    std::__cxx11::string::~string((string *)&local_50);
    local_98 = (Controller *)operator_new(0x20);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,*(char **)psVar1,(allocator<char> *)&local_50);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,(char *)*puVar4,&local_a9);
    unaff_R14 = local_98;
    Controller::Controller(local_98,&local_70,&local_90);
    bVar3 = !bVar3;
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
  }
  std::__cxx11::string::~string(local_a0);
  operator_delete(psVar2,0x20);
  psVar2 = local_a8;
  std::__cxx11::string::~string(local_a8);
  operator_delete(psVar2,0x20);
  if (unaff_R14 != (Controller *)0x0) {
    (*(unaff_R14->
      super_ControllerBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      )._vptr_ControllerBase[3])(unaff_R14);
  }
  return 0;
}

Assistant:

int main() {
    Tools *tools = Tools::getInstance();
    Logger *logger = Logger::getInstance();
    string *name = new string();
    string *operation = new string();
    string *argument = new string();
    bool choice = true;
    Controller *controller;
    while (choice) {
        cin >> name->data() >> operation->data() >> argument->data();
        if (string(name->data()) == "ex") {
            choice = false;
        }
        controller = new Controller(operation->data(), argument->data());
    }

    delete name;
    delete operation;
    delete controller;

    return 0;
}